

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_benchmark.c
# Opt level: O2

int main(void)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  bitset_container_t *pbVar7;
  ulong uVar8;
  uint32_t *out;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  timespec ts;
  
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar9 = (ulong)puVar1[2];
  uVar3 = *puVar1 >> 4;
  uVar12 = uVar3 - 0x2065;
  if (uVar12 < 0xb) {
    uVar9 = 0x481;
    if ((0x481U >> (uVar12 & 0x1f) & 1) != 0) {
      pcVar13 = "Westmere";
      goto LAB_00101ed2;
    }
    uVar9 = 0x120;
    if ((0x120U >> (uVar12 & 0x1f) & 1) != 0) {
      pcVar13 = "SandyBridge";
      goto LAB_00101ed2;
    }
    if (uVar12 != 9) goto LAB_00101bf7;
switchD_00101db2_caseD_106a:
    pcVar13 = "Nehalem";
LAB_00101ed2:
    printf("x64 processor:  %s\t",pcVar13,uVar9);
    printf(" compiler version: %s\t",
           "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
          );
    putchar(10);
    lVar14 = cpuid(0x80000006);
    if ((char)*(undefined4 *)(lVar14 + 0xc) != '@') {
      lVar14 = cpuid(0x80000006);
      printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar14 + 0xc),
             (ulong)*(uint *)(lVar14 + 8),(ulong)*(uint *)(lVar14 + 0xc));
    }
    puts("bitset container benchmarks");
    pbVar7 = bitset_container_create();
    printf("%s: ","set_test(B)");
    fflush((FILE *)0x0);
    iVar10 = 500;
    uVar9 = 0xffffffffffffffff;
    while (bVar15 = iVar10 != 0, iVar10 = iVar10 + -1, bVar15) {
      clock_gettime(3,(timespec *)&ts);
      lVar14 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar2 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      set_test(pbVar7);
      clock_gettime(3,(timespec *)&ts);
      uVar8 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar14) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar2);
      if (uVar8 < uVar9) {
        uVar9 = uVar8;
      }
    }
    printf(" %.2f cycles per operation",(double)((float)uVar9 / 21845.0));
    putchar(10);
    bVar15 = false;
    fflush((FILE *)0x0);
    iVar10 = get_test(pbVar7);
    printf("%s: ","get_test(B)");
    fflush((FILE *)0x0);
    iVar11 = 500;
    uVar9 = 0xffffffffffffffff;
    while (bVar16 = iVar11 != 0, iVar11 = iVar11 + -1, bVar16) {
      clock_gettime(3,(timespec *)&ts);
      lVar14 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar2 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      iVar4 = get_test(pbVar7);
      if (iVar4 != iVar10) {
        bVar15 = true;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar8 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar14) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar2);
      if (uVar8 < uVar9) {
        uVar9 = uVar8;
      }
    }
    printf(" %.2f cycles per operation",(double)((float)uVar9 * 1.5258789e-05));
    if (bVar15) {
      printf(" [ERROR]");
    }
    putchar(10);
    bVar15 = false;
    fflush((FILE *)0x0);
    printf("%s: ","bitset_container_cardinality(B)");
    fflush((FILE *)0x0);
    iVar11 = 500;
    uVar9 = 0xffffffffffffffff;
    while (bVar16 = iVar11 != 0, iVar11 = iVar11 + -1, bVar16) {
      clock_gettime(3,(timespec *)&ts);
      lVar14 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar2 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      if (pbVar7->cardinality != iVar10) {
        bVar15 = true;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar8 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar14) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar2);
      if (uVar8 < uVar9) {
        uVar9 = uVar8;
      }
    }
    printf(" %.2f cycles per operation",(double)uVar9);
    if (bVar15) {
      printf(" [ERROR]");
    }
    putchar(10);
    bVar15 = false;
    fflush((FILE *)0x0);
    printf("%s: ","bitset_container_compute_cardinality(B)");
    fflush((FILE *)0x0);
    iVar11 = 500;
    uVar9 = 0xffffffffffffffff;
    while (bVar16 = iVar11 != 0, iVar11 = iVar11 + -1, bVar16) {
      clock_gettime(3,(timespec *)&ts);
      lVar14 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar2 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      iVar4 = bitset_container_compute_cardinality(pbVar7);
      if (iVar4 != iVar10) {
        bVar15 = true;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar8 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar14) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar2);
      if (uVar8 < uVar9) {
        uVar9 = uVar8;
      }
    }
    printf(" %.2f cycles per operation",(double)((float)uVar9 * 0.0009765625));
    if (bVar15) {
      printf(" [ERROR]");
    }
    putchar(10);
    fflush((FILE *)0x0);
    printf("%s: ","unset_test(B)");
    fflush((FILE *)0x0);
    iVar10 = 500;
    uVar9 = 0xffffffffffffffff;
    while (bVar15 = iVar10 != 0, iVar10 = iVar10 + -1, bVar15) {
      clock_gettime(3,(timespec *)&ts);
      lVar14 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar2 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      unset_test(pbVar7);
      clock_gettime(3,(timespec *)&ts);
      uVar8 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar14) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar2);
      if (uVar8 < uVar9) {
        uVar9 = uVar8;
      }
    }
    printf(" %.2f cycles per operation",(double)((float)uVar9 / 21845.0));
    putchar(10);
    fflush((FILE *)0x0);
    bitset_container_free(pbVar7);
    for (uVar12 = 0x1000; uVar12 < 0x10001; uVar12 = uVar12 * 2) {
      pbVar7 = bitset_container_create();
      while (pbVar7->cardinality < (int)uVar12) {
        uVar5 = pcg32_random();
        bitset_container_set(pbVar7,(uint16_t)uVar5);
      }
      bVar15 = false;
      printf("\n number of values in container = %d\n");
      uVar3 = pbVar7->cardinality;
      out = (uint32_t *)malloc((ulong)uVar3 * 4 + 0x20);
      printf("%s: ","bitset_container_to_uint32_array(out, Bt, 1234)");
      fflush((FILE *)0x0);
      iVar10 = 500;
      uVar9 = 0xffffffffffffffff;
      while (bVar16 = iVar10 != 0, iVar10 = iVar10 + -1, bVar16) {
        clock_gettime(3,(timespec *)&ts);
        lVar14 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
        lVar2 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
        uVar6 = bitset_container_to_uint32_array(out,pbVar7,0x4d2);
        if (uVar6 != uVar3) {
          bVar15 = true;
        }
        clock_gettime(3,(timespec *)&ts);
        uVar8 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar14) * 1000000000 +
                (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar2);
        if (uVar8 < uVar9) {
          uVar9 = uVar8;
        }
      }
      if ((long)(int)uVar3 < 0) {
        fVar17 = (float)((ulong)(uVar3 & 1) | (ulong)(long)(int)uVar3 >> 1);
        fVar17 = fVar17 + fVar17;
      }
      else {
        fVar17 = (float)(int)uVar3;
      }
      printf(" %.2f cycles per operation",(double)((float)uVar9 / fVar17));
      if (bVar15) {
        printf(" [ERROR]");
      }
      putchar(10);
      iVar10 = 0;
      fflush((FILE *)0x0);
      free(out);
      printf("%s %s: ","bitset_container_get","bitset_cache_prefetch");
      fflush((FILE *)0x0);
      lVar14 = 0x400;
      while (bVar15 = lVar14 != 0, lVar14 = lVar14 + -1, bVar15) {
        bitset_cache_prefetch(pbVar7);
        clock_gettime(3,(timespec *)&ts);
        iVar4 = (int)ts.tv_nsec;
        iVar11 = (int)ts.tv_sec;
        clock_gettime(3,(timespec *)&ts);
        iVar10 = iVar10 + ((int)ts.tv_nsec - iVar4) + ((int)ts.tv_sec - iVar11) * 1000000000;
      }
      printf(" %.2f cycles per operation",(double)((float)iVar10 * 0.0009765625));
      putchar(10);
      iVar10 = 0;
      fflush((FILE *)0x0);
      printf("%s %s: ","bitset_container_get","bitset_cache_flush");
      fflush((FILE *)0x0);
      lVar14 = 0x400;
      while (bVar15 = lVar14 != 0, lVar14 = lVar14 + -1, bVar15) {
        bitset_cache_flush(pbVar7);
        clock_gettime(3,(timespec *)&ts);
        iVar4 = (int)ts.tv_nsec;
        iVar11 = (int)ts.tv_sec;
        clock_gettime(3,(timespec *)&ts);
        iVar10 = iVar10 + ((int)ts.tv_nsec - iVar4) + ((int)ts.tv_sec - iVar11) * 1000000000;
      }
      printf(" %.2f cycles per operation",(double)((float)iVar10 * 0.0009765625));
      putchar(10);
      fflush((FILE *)0x0);
      bitset_container_free(pbVar7);
    }
    putchar(10);
    benchmark_logical_operations();
    iVar10 = 0x1000;
    pbVar7 = bitset_container_create();
    while (bVar15 = iVar10 != 0, iVar10 = iVar10 + -1, bVar15) {
      uVar5 = pcg32_random();
      bitset_container_set(pbVar7,(uint16_t)uVar5);
    }
    iVar10 = get_cardinality_through_conversion_to_array(pbVar7);
    bVar15 = false;
    printf("%s: ","get_cardinality_through_conversion_to_array(B1)");
    fflush((FILE *)0x0);
    iVar11 = 500;
    uVar9 = 0xffffffffffffffff;
    while (bVar16 = iVar11 != 0, iVar11 = iVar11 + -1, bVar16) {
      clock_gettime(3,(timespec *)&ts);
      lVar14 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar2 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      iVar4 = get_cardinality_through_conversion_to_array(pbVar7);
      if (iVar4 != iVar10) {
        bVar15 = true;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar8 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar14) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar2);
      if (uVar8 < uVar9) {
        uVar9 = uVar8;
      }
    }
    printf(" %.2f cycles per operation",(double)((float)uVar9 * 0.0009765625));
    if (bVar15) {
      printf(" [ERROR]");
    }
    putchar(10);
    fflush((FILE *)0x0);
    bitset_container_free(pbVar7);
    return 0;
  }
LAB_00101bf7:
  switch(uVar3) {
  case 0x1066:
switchD_00101db2_caseD_1066:
    pcVar13 = "Merom";
    goto LAB_00101ed2;
  case 0x1067:
  case 0x106d:
    pcVar13 = "Penryn";
    goto LAB_00101ed2;
  case 0x1068:
  case 0x1069:
  case 0x106b:
  case 0x106c:
switchD_00101db2_caseD_1068:
    pcVar13 = "unknown";
    goto LAB_00101ed2;
  case 0x106a:
  case 0x106e:
    goto switchD_00101db2_caseD_106a;
  default:
    if (uVar3 - 99 < 2) {
      pcVar13 = "Prescott";
      goto LAB_00101ed2;
    }
    if (uVar3 - 0x806c < 2) {
      pcVar13 = "TigerLake";
      goto LAB_00101ed2;
    }
    if (uVar3 - 0xa065 < 2) {
      pcVar13 = "Cometlake";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x66) {
      pcVar13 = "Presler";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x6d) {
      pcVar13 = "Dothan";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x6f) goto switchD_00101db2_caseD_1066;
    if (uVar3 == 0x16c) {
      pcVar13 = "Pineview";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x266) {
      pcVar13 = "Lincroft";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x366) {
      pcVar13 = "Cedarview";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x306a) {
      pcVar13 = "IvyBridge";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x306c) {
      pcVar13 = "Haswell";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x306d) {
      pcVar13 = "Broadwell";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x30f1) goto LAB_00101dc0;
    if (uVar3 == 0x60f10) {
      pcVar13 = "Zen4";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x506c) {
LAB_00101e20:
      pcVar13 = "Goldmont";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x506e) {
      pcVar13 = "Skylake";
      goto LAB_00101ed2;
    }
    if (uVar3 == 0x606a) {
LAB_00101e2c:
      pcVar13 = "Icelake";
    }
    else {
      if ((uVar3 != 0x60f0) && (uVar3 != 0x60f8)) {
        if (uVar3 == 0x706a) goto LAB_00101e20;
        if (uVar3 == 0x706e) goto LAB_00101e2c;
        if (uVar3 != 0x70f1) {
          if (uVar3 != 0x806e) {
            if ((uVar3 == 0x9067) || (uVar3 == 0x906a)) {
              pcVar13 = "Alderlake";
              goto LAB_00101ed2;
            }
            if (uVar3 != 0x906e) {
              if (uVar3 != 0x90f0) {
                if (uVar3 == 0xa067) {
                  pcVar13 = "Rocketlake";
                  goto LAB_00101ed2;
                }
                if (uVar3 == 0xb067) {
                  pcVar13 = "Raptorlake";
                  goto LAB_00101ed2;
                }
                if (uVar3 != 0x20f10) {
                  if (uVar3 == 0x40f40) {
                    pcVar13 = "Zen3+";
                    goto LAB_00101ed2;
                  }
                  if (uVar3 != 0x50f00) {
                    if (uVar3 == 0x406c) {
                      pcVar13 = "CherryTrail";
                      goto LAB_00101ed2;
                    }
                    goto switchD_00101db2_caseD_1068;
                  }
                }
                pcVar13 = "Zen3";
                goto LAB_00101ed2;
              }
              goto LAB_00101dc0;
            }
          }
          pcVar13 = "Kabylake";
          goto LAB_00101ed2;
        }
      }
LAB_00101dc0:
      pcVar13 = "Zen2";
    }
    goto LAB_00101ed2;
  }
}

Assistant:

int main() {
    int size = (1 << 16) / 3;
    tellmeall();
    printf("bitset container benchmarks\n");
    bitset_container_t* B = bitset_container_create();
    BEST_TIME(set_test(B), 0, repeat, size);
    int answer = get_test(B);
    size = 1 << 16;
    BEST_TIME(get_test(B), answer, repeat, size);
    BEST_TIME(bitset_container_cardinality(B), answer, repeat, 1);
    BEST_TIME(bitset_container_compute_cardinality(B), answer, repeat,
              BITSET_CONTAINER_SIZE_IN_WORDS);

    size = (1 << 16) / 3;
    BEST_TIME(unset_test(B), 0, repeat, size);
    bitset_container_free(B);

    for (int howmany = 4096; howmany <= (1 << 16); howmany *= 2) {
        bitset_container_t* Bt = bitset_container_create();
        while (bitset_container_cardinality(Bt) < howmany) {
            bitset_container_set(Bt, (uint16_t)pcg32_random());
        }
        size_t nbrtestvalues = 1024;
        uint16_t* testvalues = malloc(nbrtestvalues * sizeof(uint16_t));
        printf("\n number of values in container = %d\n",
               bitset_container_cardinality(Bt));
        int card = bitset_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned)card + 32);
        BEST_TIME(bitset_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);
        BEST_TIME_PRE_ARRAY(Bt, bitset_container_get, bitset_cache_prefetch,
                            testvalues, nbrtestvalues);
        BEST_TIME_PRE_ARRAY(Bt, bitset_container_get, bitset_cache_flush,
                            testvalues, nbrtestvalues);
        free(testvalues);
        bitset_container_free(Bt);
    }
    printf("\n");

    benchmark_logical_operations();

    // next we are going to benchmark conversion from bitset to array (an
    // important step)
    bitset_container_t* B1 = bitset_container_create();
    for (int k = 0; k < 4096; ++k) {
        bitset_container_set(B1, (uint16_t)ranged_random(1 << 16));
    }
    answer = get_cardinality_through_conversion_to_array(B1);
    BEST_TIME(get_cardinality_through_conversion_to_array(B1), answer, repeat,
              BITSET_CONTAINER_SIZE_IN_WORDS);

    bitset_container_free(B1);
    return 0;
}